

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

SegmentBuilder * __thiscall
capnp::_::BuilderArena::addSegmentInternal<capnp::word_const>
          (BuilderArena *this,ArrayPtr<const_capnp::word> content)

{
  BuilderArena *pBVar1;
  size_t sVar2;
  Own<capnp::_::BuilderArena::MultiSegmentState> *t;
  SegmentBuilder *pSVar3;
  Own<capnp::_::SegmentBuilder> *params;
  SegmentBuilder *result;
  word *local_90;
  Id<unsigned_int,_capnp::_::Segment> local_84;
  BuilderArena *local_80;
  undefined1 local_78 [8];
  Own<capnp::_::SegmentBuilder> newBuilder;
  undefined1 local_58 [8];
  Own<capnp::_::BuilderArena::MultiSegmentState> newSegmentState;
  Own<capnp::_::BuilderArena::MultiSegmentState> *s;
  MultiSegmentState *segmentState;
  SegmentWordCount contentSize;
  Fault local_28;
  Fault f;
  BuilderArena *this_local;
  ArrayPtr<const_capnp::word> content_local;
  
  content_local.ptr = (word *)content.size_;
  this_local = (BuilderArena *)content.ptr;
  f.exception = (Exception *)this;
  pBVar1 = SegmentBuilder::getArena(&this->segment0);
  if (pBVar1 != (BuilderArena *)0x0) {
    sVar2 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)&this_local);
    segmentState._0_4_ = verifySegmentSize(sVar2);
    newSegmentState.ptr =
         (MultiSegmentState *)
         kj::_::readMaybe<capnp::_::BuilderArena::MultiSegmentState>(&this->moreSegments);
    if (newSegmentState.ptr == (MultiSegmentState *)0x0) {
      kj::heap<capnp::_::BuilderArena::MultiSegmentState>();
      s = (Own<capnp::_::BuilderArena::MultiSegmentState> *)
          kj::Own::operator_cast_to_MultiSegmentState_((Own *)local_58);
      t = kj::mv<kj::Own<capnp::_::BuilderArena::MultiSegmentState>>
                    ((Own<capnp::_::BuilderArena::MultiSegmentState> *)local_58);
      kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_>::Maybe
                ((Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_> *)&newBuilder.ptr,t);
      kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_>::operator=
                (&this->moreSegments,
                 (Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_> *)&newBuilder.ptr);
      kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_>::~Maybe
                ((Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_> *)&newBuilder.ptr);
      kj::Own<capnp::_::BuilderArena::MultiSegmentState>::~Own
                ((Own<capnp::_::BuilderArena::MultiSegmentState> *)local_58);
    }
    else {
      s = (Own<capnp::_::BuilderArena::MultiSegmentState> *)
          kj::Own::operator_cast_to_MultiSegmentState_((Own *)newSegmentState.ptr);
    }
    local_80 = this;
    sVar2 = kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::size
                      ((Vector<kj::Own<capnp::_::SegmentBuilder>_> *)s);
    kj::Id<unsigned_int,_capnp::_::Segment>::Id(&local_84,(int)sVar2 + 1);
    local_90 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)&this_local);
    result = (SegmentBuilder *)&this->dummyLimiter;
    kj::
    heap<capnp::_::SegmentBuilder,capnp::_::BuilderArena*,kj::Id<unsigned_int,capnp::_::Segment>,capnp::word_const*,unsigned_int&,capnp::_::ReadLimiter*>
              ((kj *)local_78,&local_80,&local_84,&local_90,(uint *)&segmentState,
               (ReadLimiter **)&result);
    pSVar3 = kj::Own<capnp::_::SegmentBuilder>::get((Own<capnp::_::SegmentBuilder> *)local_78);
    params = kj::mv<kj::Own<capnp::_::SegmentBuilder>>((Own<capnp::_::SegmentBuilder> *)local_78);
    kj::Vector<kj::Own<capnp::_::SegmentBuilder>>::add<kj::Own<capnp::_::SegmentBuilder>>
              ((Vector<kj::Own<capnp::_::SegmentBuilder>> *)s,params);
    sVar2 = kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::size
                      ((Vector<kj::Own<capnp::_::SegmentBuilder>_> *)s);
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::resize
              ((Vector<kj::ArrayPtr<const_capnp::word>_> *)(s + 2),sVar2 + 1);
    kj::Own<capnp::_::SegmentBuilder>::~Own((Own<capnp::_::SegmentBuilder> *)local_78);
    return pSVar3;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
             ,0xe6,FAILED,"segment0.getArena() != nullptr",
             "\"Can\'t allocate external segments before allocating the root segment.\"",
             (char (*) [69])"Can\'t allocate external segments before allocating the root segment.")
  ;
  kj::_::Debug::Fault::fatal(&local_28);
}

Assistant:

SegmentBuilder* BuilderArena::addSegmentInternal(kj::ArrayPtr<T> content) {
  // This check should never fail in practice, since you can't get an Orphanage without allocating
  // the root segment.
  KJ_REQUIRE(segment0.getArena() != nullptr,
      "Can't allocate external segments before allocating the root segment.");

  auto contentSize = verifySegmentSize(content.size());

  MultiSegmentState* segmentState;
  KJ_IF_MAYBE(s, moreSegments) {
    segmentState = *s;
  } else {
    auto newSegmentState = kj::heap<MultiSegmentState>();
    segmentState = newSegmentState;
    moreSegments = kj::mv(newSegmentState);
  }